

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  Expr<tcu::Matrix<float,_3,_4>_> *pEVar1;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar2;
  IArg3 local_26f [2];
  IArg2 local_26d [13];
  IVal local_260;
  IVal local_140;
  EvalContext *local_20;
  EvalContext *ctx_local;
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_20 = ctx;
  ctx_local = (EvalContext *)this;
  this_local = (Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                *)__return_storage_ptr__;
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_4>_>_>::
           operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_4>_>_>
                       *)&this->m_args);
  Expr<tcu::Matrix<float,_3,_4>_>::evaluate(&local_140,pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_4>_>_>::
           operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_4>_>_>
                       *)&(this->m_args).b);
  Expr<tcu::Matrix<float,_3,_4>_>::evaluate(&local_260,pEVar1,local_20);
  pEVar2 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).c);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar2,local_20);
  pEVar2 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).d);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar2,local_20);
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_140,&local_260,local_26d,local_26f);
  tcu::Matrix<tcu::Interval,_3,_4>::~Matrix(&local_260);
  tcu::Matrix<tcu::Interval,_3,_4>::~Matrix(&local_140);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}